

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLLoader.cpp
# Opt level: O2

bool anon_unknown.dwarf_ff8244::IsAsciiSTL(char *buffer,uint fileSize)

{
  bool bVar1;
  int iVar2;
  char *buffer_local;
  
  if ((((fileSize < 0x54) || (*(int *)(buffer + 0x50) * 0x32 + 0x54U != fileSize)) &&
      (buffer_local = buffer, bVar1 = Assimp::SkipSpaces<char>(&buffer_local), bVar1)) &&
     (buffer_local + 5 < buffer + fileSize)) {
    iVar2 = strncmp(buffer_local,"solid",5);
    return iVar2 == 0;
  }
  return false;
}

Assistant:

static bool IsAsciiSTL(const char* buffer, unsigned int fileSize) {
    if (IsBinarySTL(buffer, fileSize))
        return false;

    const char* bufferEnd = buffer + fileSize;

    if (!SkipSpaces(&buffer))
        return false;

    if (buffer + 5 >= bufferEnd)
        return false;

    bool isASCII( strncmp( buffer, "solid", 5 ) == 0 );
    if( isASCII ) {
        // A lot of importers are write solid even if the file is binary. So we have to check for ASCII-characters.
        if( fileSize >= BufferSize) {
            isASCII = true;
            for( unsigned int i = 0; i < BufferSize; i++ ) {
                if( buffer[ i ] > UnicodeBoundary) {
                    isASCII = false;
                    break;
                }
            }
        }
    }
    return isASCII;
}